

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

ZoneHashNode * __thiscall asmjit::ZoneHashBase::_del(ZoneHashBase *this,ZoneHashNode *node)

{
  ZoneHashNode *p;
  ZoneHashNode **pPrev;
  uint32_t hMod;
  ZoneHashNode *node_local;
  ZoneHashBase *this_local;
  
  pPrev = this->_data + *(uint *)(node + 8) % this->_bucketsCount;
  p = *pPrev;
  while( true ) {
    if (p == (ZoneHashNode *)0x0) {
      return (ZoneHashNode *)0x0;
    }
    if (p == node) break;
    pPrev = (ZoneHashNode **)p;
    p = *(ZoneHashNode **)p;
  }
  *pPrev = *(ZoneHashNode **)p;
  return node;
}

Assistant:

ZoneHashNode* ZoneHashBase::_del(ZoneHashNode* node) noexcept {
  uint32_t hMod = node->_hVal % _bucketsCount;

  ZoneHashNode** pPrev = &_data[hMod];
  ZoneHashNode* p = *pPrev;

  while (p) {
    if (p == node) {
      *pPrev = p->_hashNext;
      return node;
    }

    pPrev = &p->_hashNext;
    p = *pPrev;
  }

  return nullptr;
}